

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O1

Token __thiscall slang::syntax::SyntaxNode::getFirstToken(SyntaxNode *this)

{
  variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *__v;
  SyntaxNode *pSVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar3;
  ConstGetChildVisitor *in_RCX;
  unsigned_long *in_R8;
  SyntaxNode *pSVar4;
  Token TVar5;
  Token result;
  ConstTokenOrSyntax child;
  Token local_58;
  undefined1 local_48 [24];
  char local_30;
  undefined1 auVar6 [14];
  Info *pIVar7;
  
  pSVar1 = (SyntaxNode *)getChildCount(this);
  if (pSVar1 != (SyntaxNode *)0x0) {
    pSVar4 = (SyntaxNode *)0x0;
    __v = (variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)(local_48 + 8);
    do {
      local_48._0_8_ = pSVar4;
      detail::
      visitSyntaxNode<slang::syntax::SyntaxNode_const,(anonymous_namespace)::ConstGetChildVisitor,unsigned_long&>
                ((ConstTokenOrSyntax *)__v,(detail *)this,(SyntaxNode *)local_48,in_RCX,in_R8);
      if (local_30 == '\0') {
        pvVar3 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
        if (pvVar3->info != (Info *)0x0) {
          pvVar3 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (local_48 + 8));
          TVar5.kind = pvVar3->kind;
          auVar6[2] = pvVar3->field_0x2;
          auVar6[3] = (pvVar3->numFlags).raw;
          auVar6._4_4_ = pvVar3->rawLen;
          register0x00000010 = pvVar3->info;
          return TVar5;
        }
      }
      else {
        ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
        if (*ppSVar2 != (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
          ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
          local_58 = getFirstToken(*ppSVar2);
          if (local_58.info != (Info *)0x0) {
            return local_58;
          }
        }
      }
      pSVar4 = (SyntaxNode *)((long)&pSVar4->parent + 1);
    } while (pSVar1 != pSVar4);
  }
  parsing::Token::Token(&local_58);
  return local_58;
}

Assistant:

parsing::Token SyntaxNode::getFirstToken() const {
    size_t childCount = getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        auto child = getChild(i);
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getFirstToken();
            if (result)
                return result;
        }
    }
    return Token();
}